

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Scene::~Scene(Scene *this)

{
  shared_ptr<pbrt::syntactic::Object> *in_RDI;
  shared_ptr<pbrt::syntactic::Object> *in_stack_ffffffffffffffd8;
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  *in_stack_fffffffffffffff0;
  
  (in_RDI->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__Scene_0029a548;
  std::shared_ptr<pbrt::syntactic::Object>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<pbrt::syntactic::Object>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::shared_ptr<pbrt::syntactic::Object>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Object> *)0x1a665f);
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::shared_ptr<pbrt::syntactic::Object>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Object> *)0x1a6681);
  std::shared_ptr<pbrt::syntactic::PixelFilter>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::PixelFilter> *)0x1a668f);
  std::shared_ptr<pbrt::syntactic::SurfaceIntegrator>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::SurfaceIntegrator> *)0x1a669d);
  std::shared_ptr<pbrt::syntactic::VolumeIntegrator>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::VolumeIntegrator> *)0x1a66ab);
  std::shared_ptr<pbrt::syntactic::Integrator>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Integrator> *)0x1a66b9);
  std::shared_ptr<pbrt::syntactic::Sampler>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Sampler> *)0x1a66c7);
  std::shared_ptr<pbrt::syntactic::Film>::~shared_ptr((shared_ptr<pbrt::syntactic::Film> *)0x1a66d5)
  ;
  std::
  vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
  ::~vector(in_stack_fffffffffffffff0);
  return;
}

Assistant:

virtual ~Scene()
      {
        world = nullptr;
      }